

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddSubDirectoryCommand.cxx
# Opt level: O0

bool __thiscall
cmAddSubDirectoryCommand::InitialPass
          (cmAddSubDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  size_t sVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pbVar5;
  char *pcVar6;
  ulong uVar7;
  ostream *poVar8;
  string local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  allocator local_389;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  ulong local_348;
  size_t binLen;
  size_t srcLen;
  char *bin;
  char *src;
  undefined1 local_308 [8];
  ostringstream e;
  allocator local_189;
  string local_188;
  undefined1 local_168 [8];
  string binPath;
  allocator local_121;
  undefined1 local_120 [8];
  string error;
  string srcPath;
  string local_d8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  const_iterator i;
  string local_a0 [7];
  bool excludeFromAll;
  string binArg;
  string srcArg;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmAddSubDirectoryCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_004d1c3a;
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  std::__cxx11::string::string((string *)(binArg.field_2._M_local_buf + 8),(string *)pvVar4);
  std::__cxx11::string::string(local_a0);
  i._M_current._7_1_ = 0;
  local_b0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(&local_b0);
  while( true ) {
    local_b8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local);
    bVar2 = __gnu_cxx::operator!=(&local_b0,&local_b8);
    if (!bVar2) break;
    pbVar5 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_b0);
    bVar2 = std::operator==(pbVar5,"EXCLUDE_FROM_ALL");
    if (bVar2) {
      i._M_current._7_1_ = 1;
    }
    else {
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_d8,"called with incorrect number of arguments",
                   (allocator *)(srcPath.field_2._M_local_buf + 0xf));
        cmCommand::SetError(&this->super_cmCommand,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::allocator<char>::~allocator((allocator<char> *)(srcPath.field_2._M_local_buf + 0xf));
        this_local._7_1_ = 0;
        srcPath.field_2._8_4_ = 1;
        goto LAB_004d1c0c;
      }
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_b0);
      std::__cxx11::string::operator=(local_a0,(string *)pbVar5);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_b0);
  }
  std::__cxx11::string::string((string *)(error.field_2._M_local_buf + 8));
  pcVar6 = (char *)std::__cxx11::string::c_str();
  bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar6);
  if (bVar2) {
    std::__cxx11::string::operator=
              ((string *)(error.field_2._M_local_buf + 8),
               (string *)(binArg.field_2._M_local_buf + 8));
  }
  else {
    pcVar6 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::operator=((string *)(error.field_2._M_local_buf + 8),pcVar6);
    std::__cxx11::string::operator+=((string *)(error.field_2._M_local_buf + 8),"/");
    std::__cxx11::string::operator+=
              ((string *)(error.field_2._M_local_buf + 8),
               (string *)(binArg.field_2._M_local_buf + 8));
  }
  bVar2 = cmsys::SystemTools::FileIsDirectory((string *)((long)&error.field_2 + 8));
  if (bVar2) {
    cmsys::SystemTools::CollapseFullPath
              ((string *)((long)&binPath.field_2 + 8),(string *)((long)&error.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)(error.field_2._M_local_buf + 8),
               (string *)(binPath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(binPath.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_168);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      pcVar6 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar6);
      if (bVar2) {
        std::__cxx11::string::operator=((string *)local_168,local_a0);
      }
      else {
        pcVar6 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
        std::__cxx11::string::operator=((string *)local_168,pcVar6);
        std::__cxx11::string::operator+=((string *)local_168,"/");
        std::__cxx11::string::operator+=((string *)local_168,local_a0);
      }
LAB_004d1b54:
      cmsys::SystemTools::CollapseFullPath(&local_3d0,(string *)local_168);
      std::__cxx11::string::operator=((string *)local_168,(string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_3d0);
      cmMakefile::AddSubDirectory
                ((this->super_cmCommand).Makefile,(string *)((long)&error.field_2 + 8),
                 (string *)local_168,(bool)(i._M_current._7_1_ & 1),true);
      this_local._7_1_ = 1;
      srcPath.field_2._8_4_ = 1;
    }
    else {
      pcVar6 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_188,pcVar6,&local_189);
      bVar2 = cmsys::SystemTools::IsSubDirectory((string *)((long)&error.field_2 + 8),&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator((allocator<char> *)&local_189);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        bin = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
        srcLen = (size_t)cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
        binLen = strlen(bin);
        local_348 = strlen((char *)srcLen);
        sVar1 = srcLen;
        if ((binLen != 0) && (bin[binLen - 1] == '/')) {
          binLen = binLen - 1;
        }
        if ((local_348 != 0) && (*(char *)(srcLen + (local_348 - 1)) == '/')) {
          local_348 = local_348 - 1;
        }
        uVar7 = local_348;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_388,(char *)sVar1,uVar7,&local_389);
        std::__cxx11::string::substr((ulong)&local_3b0,(ulong)((long)&error.field_2 + 8));
        std::operator+(&local_368,&local_388,&local_3b0);
        std::__cxx11::string::operator=((string *)local_168,(string *)&local_368);
        std::__cxx11::string::~string((string *)&local_368);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_388);
        std::allocator<char>::~allocator((allocator<char> *)&local_389);
        goto LAB_004d1b54;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
      poVar8 = std::operator<<((ostream *)local_308,
                               "not given a binary directory but the given source directory ");
      poVar8 = std::operator<<(poVar8,"\"");
      poVar8 = std::operator<<(poVar8,(string *)(error.field_2._M_local_buf + 8));
      poVar8 = std::operator<<(poVar8,"\" is not a subdirectory of \"");
      pcVar6 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      poVar8 = std::operator<<(poVar8,pcVar6);
      poVar8 = std::operator<<(poVar8,"\".  ");
      poVar8 = std::operator<<(poVar8,"When specifying an out-of-tree source a binary directory ");
      std::operator<<(poVar8,"must be explicitly specified.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&src);
      std::__cxx11::string::~string((string *)&src);
      this_local._7_1_ = 0;
      srcPath.field_2._8_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
    }
    std::__cxx11::string::~string((string *)local_168);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_120,"given source \"",&local_121);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::__cxx11::string::operator+=
              ((string *)local_120,(string *)(binArg.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_120,"\" which is not an existing directory.");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_120);
    this_local._7_1_ = 0;
    srcPath.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_120);
  }
  std::__cxx11::string::~string((string *)(error.field_2._M_local_buf + 8));
LAB_004d1c0c:
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string((string *)(binArg.field_2._M_local_buf + 8));
LAB_004d1c3a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmAddSubDirectoryCommand::InitialPass
(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // store the binpath
  std::string srcArg = args[0];
  std::string binArg;

  bool excludeFromAll = false;

  // process the rest of the arguments looking for optional args
  std::vector<std::string>::const_iterator i = args.begin();
  ++i;
  for(;i != args.end(); ++i)
    {
    if(*i == "EXCLUDE_FROM_ALL")
      {
      excludeFromAll = true;
      continue;
      }
    else if (binArg.empty())
      {
      binArg = *i;
      }
    else
      {
      this->SetError("called with incorrect number of arguments");
      return false;
      }
    }

  // Compute the full path to the specified source directory.
  // Interpret a relative path with respect to the current source directory.
  std::string srcPath;
  if(cmSystemTools::FileIsFullPath(srcArg.c_str()))
    {
    srcPath = srcArg;
    }
  else
    {
    srcPath = this->Makefile->GetCurrentSourceDirectory();
    srcPath += "/";
    srcPath += srcArg;
    }
  if(!cmSystemTools::FileIsDirectory(srcPath))
    {
    std::string error = "given source \"";
    error += srcArg;
    error += "\" which is not an existing directory.";
    this->SetError(error);
    return false;
    }
  srcPath = cmSystemTools::CollapseFullPath(srcPath);

  // Compute the full path to the binary directory.
  std::string binPath;
  if(binArg.empty())
    {
    // No binary directory was specified.  If the source directory is
    // not a subdirectory of the current directory then it is an
    // error.
    if(!cmSystemTools::IsSubDirectory(srcPath,
          this->Makefile->GetCurrentSourceDirectory()))
      {
      std::ostringstream e;
      e << "not given a binary directory but the given source directory "
        << "\"" << srcPath << "\" is not a subdirectory of \""
        << this->Makefile->GetCurrentSourceDirectory() << "\".  "
        << "When specifying an out-of-tree source a binary directory "
        << "must be explicitly specified.";
      this->SetError(e.str());
      return false;
      }

    // Remove the CurrentDirectory from the srcPath and replace it
    // with the CurrentOutputDirectory.
    const char* src = this->Makefile->GetCurrentSourceDirectory();
    const char* bin = this->Makefile->GetCurrentBinaryDirectory();
    size_t srcLen = strlen(src);
    size_t binLen = strlen(bin);
    if(srcLen > 0 && src[srcLen-1] == '/')
      { --srcLen; }
    if(binLen > 0 && bin[binLen-1] == '/')
      { --binLen; }
    binPath = std::string(bin, binLen) + srcPath.substr(srcLen);
    }
  else
    {
    // Use the binary directory specified.
    // Interpret a relative path with respect to the current binary directory.
    if(cmSystemTools::FileIsFullPath(binArg.c_str()))
      {
      binPath = binArg;
      }
    else
      {
      binPath = this->Makefile->GetCurrentBinaryDirectory();
      binPath += "/";
      binPath += binArg;
      }
    }
  binPath = cmSystemTools::CollapseFullPath(binPath);

  // Add the subdirectory using the computed full paths.
  this->Makefile->AddSubDirectory(srcPath, binPath,
                                  excludeFromAll, true);

  return true;
}